

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii-parser-basetype.cc
# Opt level: O2

bool __thiscall tinyusdz::ascii::AsciiParser::MaybeNonFinite<double>(AsciiParser *this,double *out)

{
  bool bVar1;
  uint64_t pos;
  double dVar2;
  allocator_type local_41;
  vector<char,_std::allocator<char>_> buf;
  
  pos = CurrLoc(this);
  std::vector<char,_std::allocator<char>_>::vector
            ((vector<char,_std::allocator<char>_> *)&buf,4,&local_41);
  bVar1 = CharN(this,3,&buf);
  if (bVar1) {
    SeekTo(this,pos);
    if (*buf.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
         _M_start == 'n') {
      if ((buf.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
           _M_start[1] != 'a') ||
         (buf.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
          _M_start[2] != 'n')) goto LAB_0032cce4;
      dVar2 = NAN;
    }
    else if (((*buf.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
                _M_start == 'i') &&
             (buf.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
              _M_start[1] == 'n')) &&
            (buf.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
             _M_start[2] == 'f')) {
      dVar2 = INFINITY;
    }
    else {
LAB_0032cce4:
      bVar1 = CharN(this,4,&buf);
      SeekTo(this,pos);
      if (((!bVar1) ||
          (*buf.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
            _M_start != '-')) ||
         ((buf.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
           _M_start[1] != 'i' ||
          ((buf.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
            _M_start[2] != 'n' ||
           (buf.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
            _M_start[3] != 'f')))))) goto LAB_0032cd32;
      dVar2 = -INFINITY;
    }
    *out = dVar2;
    bVar1 = true;
  }
  else {
LAB_0032cd32:
    bVar1 = false;
  }
  std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
            ((_Vector_base<char,_std::allocator<char>_> *)&buf);
  return bVar1;
}

Assistant:

bool AsciiParser::MaybeNonFinite(T *out) {
  auto loc = CurrLoc();

  // "-inf", "inf" or "nan"
  std::vector<char> buf(4);
  if (!CharN(3, &buf)) {
    return false;
  }
  SeekTo(loc);

  if ((buf[0] == 'i') && (buf[1] == 'n') && (buf[2] == 'f')) {
    (*out) = std::numeric_limits<T>::infinity();
    return true;
  }

  if ((buf[0] == 'n') && (buf[1] == 'a') && (buf[2] == 'n')) {
    (*out) = std::numeric_limits<T>::quiet_NaN();
    return true;
  }

  bool ok = CharN(4, &buf);
  SeekTo(loc);

  if (ok) {
    if ((buf[0] == '-') && (buf[1] == 'i') && (buf[2] == 'n') &&
        (buf[3] == 'f')) {
      (*out) = -std::numeric_limits<T>::infinity();
      return true;
    }

    // NOTE: support "-nan"?
  }

  return false;
}